

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
__thiscall ninx::parser::Parser::parse_implicit_block_until(Parser *this,char end_limiter)

{
  bool bVar1;
  int iVar2;
  unique_ptr *this_00;
  char in_DL;
  undefined7 in_register_00000031;
  undefined1 local_60 [8];
  __single_object block;
  unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
  local_50;
  unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
  current;
  undefined1 local_38 [8];
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  statements;
  char end_limiter_local;
  Parser *this_local;
  
  statements.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = in_DL;
  std::
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ::vector((vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
            *)local_38);
  iVar2 = TokenReader::check_limiter
                    ((TokenReader *)(CONCAT71(in_register_00000031,end_limiter) + 0x20),
                     statements.
                     super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
  if (iVar2 != 1) {
    std::
    unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
    ::unique_ptr<std::default_delete<ninx::parser::element::Statement>,void>
              ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
                *)&local_50);
    do {
      parse_statement((Parser *)&block);
      this_00 = (unique_ptr *)
                std::
                unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
                ::operator=(&local_50,
                            (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
                             *)&block);
      bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
      std::
      unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
      ::~unique_ptr((unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
                     *)&block);
      if (!bVar1) break;
      bVar1 = std::operator!=(&local_50,(nullptr_t)0x0);
      if (bVar1) {
        std::
        vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
        ::push_back((vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
                     *)local_38,&local_50);
      }
      iVar2 = TokenReader::check_limiter
                        ((TokenReader *)(CONCAT71(in_register_00000031,end_limiter) + 0x20),
                         statements.
                         super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
    } while (iVar2 < 1);
    std::
    unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
    ::~unique_ptr(&local_50);
  }
  std::
  make_unique<ninx::parser::element::Block,std::vector<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>,std::allocator<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>>>
            ((vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
              *)local_60);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)this,(unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                        *)local_60);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_60);
  std::
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
             *)local_38);
  return (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Block> ninx::parser::Parser::parse_implicit_block_until(char end_limiter) {
    std::vector<std::unique_ptr<Statement>> statements;

    // Make sure this is not an empty block
    if (reader.check_limiter(end_limiter) != 1) {

        // Not empty, cycle to get all the statements
        std::unique_ptr<Statement> current;
        while ((current = parse_statement())) {
            if (current != nullptr) {
                statements.push_back(std::move(current));
            }

            // Check if the block will be closed
            if (reader.check_limiter(end_limiter) > 0) {
                // Exit the cycle, because the next token marks the end of a block
                break;
            }
        }
    }

    auto block = std::make_unique<Block>(std::move(statements));
    return std::move(block);
}